

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting.hpp
# Opt level: O2

double ising::counting::free_energy<lattice::graph>(double beta,graph *lat,double J,double H)

{
  size_type __n;
  allocator_type local_59;
  double local_58;
  double local_50;
  double H_local;
  vector<double,_std::allocator<double>_> field;
  vector<double,_std::allocator<double>_> inter;
  double J_local;
  
  local_58 = H;
  local_50 = beta;
  H_local = H;
  J_local = J;
  std::vector<double,_std::allocator<double>_>::vector
            (&inter,((long)(lat->bonds_).
                           super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(lat->bonds_).
                          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18,&J_local,
             (allocator_type *)&field);
  if ((local_58 != 0.0) || (NAN(local_58))) {
    __n = ((long)(lat->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(lat->sites_).
                super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x38;
  }
  else {
    __n = 0;
  }
  std::vector<double,_std::allocator<double>_>::vector(&field,__n,&H_local,&local_59);
  local_58 = free_energy<lattice::graph>(local_50,lat,&inter,&field);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&field.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&inter.super__Vector_base<double,_std::allocator<double>_>);
  return local_58;
}

Assistant:

static double free_energy(double beta, LATTICE const& lat, double J, double H = 0.0) {
    std::vector<double> inter(lat.num_bonds(), J);
    std::vector<double> field((H != 0.0) ? lat.num_sites() : 0, H);
    return free_energy(beta, lat, inter, field);
  }